

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxIntCast::Resolve(FxIntCast *this,FCompileContext *ctx)

{
  PString *pPVar1;
  PInt *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FxExpression *pFVar4;
  long lVar5;
  FxJumpStatement **ppFVar6;
  int iVar7;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *pTVar8;
  FxExpression *x;
  ExpVal constval;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar3 = (*this->basex->_vptr_FxExpression[2])();
      pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
      this->basex = pFVar4;
      if (pFVar4 != (FxExpression *)0x0) {
        iVar3 = (*(pFVar4->ValueType->super_DObject)._vptr_DObject[0x12])();
        pFVar4 = this->basex;
        if (iVar3 == 0) {
          if (pFVar4->ValueType == (PType *)TypeName) {
            iVar3 = (*pFVar4->_vptr_FxExpression[3])(pFVar4);
            if ((char)iVar3 == '\0') {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got a name");
            }
            else {
              pPVar1 = (PString *)this->basex[1]._vptr_FxExpression;
              pTVar8 = &this->basex[1].JumpAddresses;
              if (pPVar1 == TypeString) {
                FString::AttachToOther(&local_30,(FString *)pTVar8);
                ppFVar6 = (FxJumpStatement **)((ulong)local_30.Chars & 0xffffffff);
              }
              else {
                ppFVar6 = pTVar8->Array;
                local_30.Chars = (char *)ppFVar6;
              }
              lVar5 = (long)(int)ppFVar6;
              if (pPVar1 != (PString *)TypeName) {
                lVar5 = 0;
              }
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got \"%s\"",FName::NameData.NameArray[lVar5].Text);
              if (pPVar1 == TypeString) {
                FString::~FString(&local_30);
              }
            }
            pFVar4 = (FxExpression *)operator_new(0x48);
            FxExpression::FxExpression(pFVar4,&(this->super_FxExpression).ScriptPosition);
            pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
            pPVar2 = TypeSInt32;
            *(PInt **)(pFVar4 + 1) = TypeSInt32;
            pFVar4->ValueType = (PType *)pPVar2;
            *(undefined4 *)&pFVar4[1].JumpAddresses.Array = 0;
            pFVar4->isresolved = true;
          }
          else {
            this->basex = (FxExpression *)0x0;
          }
        }
        else {
          iVar3 = (**(code **)(*(long *)&pFVar4->ValueType->super_DObject + 0x90))();
          if (iVar3 == 1) {
            iVar3 = (*this->basex->_vptr_FxExpression[3])();
            if ((char)iVar3 == '\0') {
              return &this->super_FxExpression;
            }
            pPVar1 = (PString *)this->basex[1]._vptr_FxExpression;
            pTVar8 = &this->basex[1].JumpAddresses;
            if (pPVar1 == TypeString) {
              FString::AttachToOther(&local_30,(FString *)pTVar8);
            }
            else {
              local_30.Chars = (char *)pTVar8->Array;
            }
            pFVar4 = (FxExpression *)operator_new(0x48);
            iVar3 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            if (iVar3 == 1) {
              iVar7 = (int)(double)local_30.Chars;
            }
            else {
              iVar7 = 0;
              if (iVar3 == 0) {
                iVar7 = (int)local_30.Chars;
              }
            }
            FxExpression::FxExpression(pFVar4,&(this->super_FxExpression).ScriptPosition);
            pFVar4->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
            pPVar2 = TypeSInt32;
            *(PInt **)(pFVar4 + 1) = TypeSInt32;
            pFVar4->ValueType = (PType *)pPVar2;
            *(int *)&pFVar4[1].JumpAddresses.Array = iVar7;
            pFVar4->isresolved = true;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            if (pPVar1 != TypeString) {
              return pFVar4;
            }
            FString::~FString(&local_30);
            return pFVar4;
          }
          pFVar4 = (FxExpression *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return pFVar4;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxIntCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxIntCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			FxExpression *x = basex;
			basex = NULL;
			delete this;
			return x;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant())	ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression * x = new FxConstant(0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetInt(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return NULL;
}